

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager_p.h
# Opt level: O2

QNetworkReply * __thiscall
QRestAccessManagerPrivate::executeRequest
          (QRestAccessManagerPrivate *this,ReqOpRef requestOperation,QObject *context,
          QSlotObjectBase *rawSlot)

{
  QNetworkReply *pQVar1;
  long in_FS_OFFSET;
  unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> local_48;
  __uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> local_40;
  QNetworkAccessManager *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_t.
  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
  super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
       (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)rawSlot;
  if (this->qnam == (QNetworkAccessManager *)0x0) {
    warnNoAccessManager(this);
    pQVar1 = (QNetworkReply *)0x0;
  }
  else {
    verifyThreadAffinity(this,context);
    local_38 = this->qnam;
    pQVar1 = (*requestOperation.
               super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*>.
               m_thunk_ptr)(requestOperation.
                            super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*>
                            .m_bound_entity,&local_38);
    local_40._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (tuple<QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)
         (_Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>)0x0;
    local_48._M_t.
    super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
          )(__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
            )rawSlot;
    pQVar1 = createActiveRequest(this,pQVar1,context,(SlotObjUniquePtr)&local_48);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
              (&local_48);
  }
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *executeRequest(ReqOpRef requestOperation,
                                  const QObject *context, QtPrivate::QSlotObjectBase *rawSlot)
    {
        QtPrivate::SlotObjUniquePtr slot(rawSlot);
        if (!qnam)
            return warnNoAccessManager();
        verifyThreadAffinity(context);
        QNetworkReply *reply = requestOperation(qnam);
        return createActiveRequest(reply, context, std::move(slot));
    }